

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O1

string * __thiscall
t_c_glib_generator::constant_value_with_storage
          (string *__return_storage_ptr__,t_c_glib_generator *this,string *fname,t_type *etype,
          t_const_value *value)

{
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  ostringstream render;
  string local_250;
  string local_230;
  string *local_210;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  iVar2 = (*(etype->super_t_doc)._vptr_t_doc[10])(etype);
  if (((char)iVar2 == '\0') &&
     ((iVar2 = (*(etype->super_t_doc)._vptr_t_doc[5])(etype), (char)iVar2 == '\0' ||
      (iVar2 = (*(etype->super_t_doc)._vptr_t_doc[6])(etype), (char)iVar2 != '\0')))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
    type_name_abi_cxx11_(&local_230,this,etype,false,false);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(fname->_M_dataplus)._M_p,fname->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    pcVar1 = (fname->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,pcVar1,pcVar1 + fname->_M_string_length);
    constant_value(&local_250,this,&local_208,etype,value);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_250._M_dataplus._M_p,local_250._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    local_250._M_dataplus._M_p = local_208._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p == &local_208.field_2) goto LAB_00156a4d;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
    type_name_abi_cxx11_(&local_230,this,etype,false,false);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," *",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(fname->_M_dataplus)._M_p,fname->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"g_new (",7);
    base_type_name_abi_cxx11_(&local_250,this,etype);
    local_210 = __return_storage_ptr__;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_250._M_dataplus._M_p,local_250._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", 1);",5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"    *",5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(fname->_M_dataplus)._M_p,fname->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
    pcVar1 = (fname->_M_dataplus)._M_p;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,pcVar1,pcVar1 + fname->_M_string_length);
    constant_value(&local_1c8,this,&local_1e8,etype,value);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    __return_storage_ptr__ = local_210;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p == &local_250.field_2) goto LAB_00156a4d;
  }
  operator_delete(local_250._M_dataplus._M_p);
LAB_00156a4d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string t_c_glib_generator::constant_value_with_storage(string fname,
                                                       t_type* etype,
                                                       t_const_value* value) {
  ostringstream render;
  if (is_numeric(etype)) {
    render << "    " << type_name(etype) << " *" << fname << " = "
           << "g_new (" << base_type_name(etype) << ", 1);" << endl
           << "    *" << fname << " = " << constant_value(fname, (t_type*)etype, value) << ";"
           << endl;
  } else {
    render << "    " << type_name(etype) << " " << fname << " = "
           << constant_value(fname, (t_type*)etype, value) << ";" << endl;
  }
  return render.str();
}